

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistoQueueUpdateHead(HistoQueue *histo_queue,HistogramPair *pair)

{
  void *in_RSI;
  long *in_RDI;
  HistogramPair tmp;
  undefined1 local_50 [64];
  void *local_10;
  long *local_8;
  
  if (*(long *)((long)in_RSI + 8) < *(long *)(*in_RDI + 8)) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    memcpy(local_50,(void *)*in_RDI,0x40);
    memcpy((void *)*local_8,local_10,0x40);
    memcpy(local_10,local_50,0x40);
  }
  return;
}

Assistant:

static void HistoQueueUpdateHead(HistoQueue* const histo_queue,
                                 HistogramPair* const pair) {
  assert(pair->cost_diff < 0);
  assert(pair >= histo_queue->queue &&
         pair < (histo_queue->queue + histo_queue->size));
  assert(histo_queue->size > 0);
  if (pair->cost_diff < histo_queue->queue[0].cost_diff) {
    // Replace the best pair.
    const HistogramPair tmp = histo_queue->queue[0];
    histo_queue->queue[0] = *pair;
    *pair = tmp;
  }
}